

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

void add_bridge_stones(EVdfg dfg,EVdfg_configuration config)

{
  int iVar1;
  uint uVar2;
  EVint_node_list p_Var3;
  _EVdfg_config_action *p_Var4;
  CManager cm;
  FILE *__stream;
  EVdfg_config_action act_00;
  EVdfg_config_action act_01;
  int iVar5;
  __pid_t _Var6;
  EVdfg_stone_state *pp_Var7;
  EVdfg_stone *pp_Var8;
  EVdfg_stone_state p_Var9;
  pthread_t pVar10;
  char **ppcVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  EVdfg_stone_state p_Var15;
  EVdfg_stone_state p_Var16;
  EVdfg_config_action act;
  timespec local_80;
  char *local_70;
  int iStack_68;
  undefined4 uStack_64;
  long local_60;
  long local_58;
  undefined4 local_50;
  uint uStack_4c;
  int iStack_48;
  undefined4 uStack_44;
  undefined4 local_40;
  int iStack_3c;
  undefined8 uStack_38;
  
  if (0 < config->stone_count) {
    lVar14 = 0;
    do {
      pp_Var7 = config->stones;
      p_Var15 = pp_Var7[lVar14];
      if (0 < p_Var15->out_count) {
        lVar12 = 0;
        local_58 = lVar14;
        do {
          if ((long)config->stone_count < 1) {
            p_Var16 = (EVdfg_stone_state)0x0;
          }
          else {
            lVar13 = 0;
            p_Var16 = (EVdfg_stone_state)0x0;
            do {
              if (pp_Var7[lVar13]->stone_id == p_Var15->out_links[lVar12]) {
                p_Var16 = pp_Var7[lVar13];
              }
              lVar13 = lVar13 + 1;
            } while (config->stone_count != lVar13);
          }
          if ((p_Var16 != (EVdfg_stone_state)0x0) && (p_Var15->bridge_stone == 0)) {
            iVar5 = p_Var15->node;
            iVar1 = p_Var16->node;
            if (iVar5 != iVar1) {
              p_Var3 = dfg->master->nodes;
              ppcVar11 = &dfg->master->my_contact_str;
              if (p_Var3[iVar1].self == 0) {
                ppcVar11 = &p_Var3[iVar1].str_contact_list;
              }
              local_70 = INT_create_bridge_action_spec(p_Var16->stone_id,*ppcVar11);
              local_80.tv_sec._0_4_ = 0xd;
              iStack_68 = p_Var16->stone_id;
              uVar2 = dfg->stone_count;
              dfg->stone_count = uVar2 + 1;
              local_80.tv_sec._4_4_ = uVar2 | 0x80000000;
              pp_Var8 = (EVdfg_stone *)INT_CMrealloc(dfg->stones,(long)(int)uVar2 * 8 + 8);
              dfg->stones = pp_Var8;
              pp_Var8[(long)dfg->stone_count + -1] = (EVdfg_stone)0x0;
              act_00.stone_id = local_80.tv_sec._4_4_;
              act_00.type = (undefined4)local_80.tv_sec;
              act_00._12_4_ = local_80.tv_nsec._4_4_;
              act_00.node_for_action = iVar5;
              act_00.u._12_4_ = uStack_64;
              act_00.u.bridge.target_id = iStack_68;
              act_00.u.bridge.action = local_70;
              local_80.tv_nsec._0_4_ = iVar5;
              EVdfg_perform_act_on_state(dfg->working_state,act_00,1);
              uVar2 = local_80.tv_sec._4_4_;
              local_50 = 5;
              uStack_4c = local_80.tv_sec._4_4_;
              iStack_3c = p_Var16->stone_id;
              act_01.stone_id = local_80.tv_sec._4_4_;
              act_01.type = 5;
              act_01._12_4_ = uStack_44;
              act_01.node_for_action = iVar5;
              act_01.u.period.usecs = iStack_3c;
              act_01.u.period.secs = local_40;
              act_01.u._8_8_ = uStack_38;
              iStack_48 = iVar5;
              EVdfg_perform_act_on_state(dfg->working_state,act_01,0);
              p_Var15->out_links[lVar12] = uVar2;
              if ((long)config->stone_count < 1) {
                p_Var9 = (EVdfg_stone_state)0x0;
              }
              else {
                lVar14 = 0;
                p_Var9 = (EVdfg_stone_state)0x0;
                do {
                  if (config->stones[lVar14]->stone_id == uVar2) {
                    p_Var9 = config->stones[lVar14];
                  }
                  lVar14 = lVar14 + 1;
                } while (config->stone_count != lVar14);
              }
              if (0 < (long)config->pending_action_count) {
                p_Var4 = config->pending_action_queue;
                lVar14 = 0;
                do {
                  if (((*(uint *)((long)&p_Var4->type + lVar14) & 0xfffffffe) == 4) &&
                     (*(int *)((long)&p_Var4->u + lVar14 + 4) == p_Var16->stone_id)) {
                    *(int *)((long)&p_Var4->u + lVar14 + 4) = p_Var9->stone_id;
                    break;
                  }
                  lVar14 = lVar14 + 0x20;
                } while ((long)config->pending_action_count * 0x20 != lVar14);
              }
              p_Var9->node = p_Var15->node;
              cm = dfg->master->cm;
              iVar5 = CMtrace_val[0xd];
              if (cm->CMTrace_file == (FILE *)0x0) {
                iVar5 = CMtrace_init(cm,EVdfgVerbose);
              }
              if (iVar5 != 0) {
                if (CMtrace_PID != 0) {
                  __stream = (FILE *)dfg->master->cm->CMTrace_file;
                  _Var6 = getpid();
                  local_60 = (long)_Var6;
                  pVar10 = pthread_self();
                  fprintf(__stream,"P%lxT%lx - ",local_60,pVar10);
                }
                if (CMtrace_timing != 0) {
                  clock_gettime(1,&local_80);
                  fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",
                          CONCAT44(local_80.tv_sec._4_4_,(undefined4)local_80.tv_sec),
                          CONCAT44(local_80.tv_nsec._4_4_,(int)local_80.tv_nsec));
                }
                fprintf((FILE *)dfg->master->cm->CMTrace_file,
                        "Created bridge stone %x, target node is %d, assigned to node %d\n",
                        (ulong)(uint)p_Var15->out_links[lVar12],(ulong)(uint)p_Var16->node,
                        (ulong)(uint)p_Var15->node);
              }
              fflush((FILE *)dfg->master->cm->CMTrace_file);
              lVar14 = local_58;
            }
          }
          lVar12 = lVar12 + 1;
          pp_Var7 = config->stones;
          p_Var15 = pp_Var7[lVar14];
        } while (lVar12 < p_Var15->out_count);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < config->stone_count);
  }
  return;
}

Assistant:

static void
add_bridge_stones(EVdfg dfg, EVdfg_configuration config)
{
    int i;
    for (i=0; i< config->stone_count; i++) {
	int j;
	for (j = 0; j < config->stones[i]->out_count; j++) {
	    EVdfg_stone_state cur = config->stones[i];
	    EVdfg_stone_state target = NULL;
	    int k;
	    for (k = 0; k < config->stone_count; k++) {
		if (config->stones[k]->stone_id == cur->out_links[j]) {
		    target = config->stones[k];
		}
	    }
	    if (target && (!cur->bridge_stone) && (cur->node != target->node)) {
		EVdfg_stone_state bridge = NULL;
		cur->out_links[j] = create_bridge_stone(dfg, target, cur->node);
		/* put the bridge stone where the source stone is */
		for (k = 0; k < config->stone_count; k++) {
		    if (config->stones[k]->stone_id == cur->out_links[j]) {
			bridge = config->stones[k];
		    }
		}
		for (k = 0; k < config->pending_action_count; k++) {
		    EVdfg_config_action act = config->pending_action_queue[k];
		    if (((act.type == ACT_link_port) || (act.type == ACT_link_dest)) &&
			(act.u.link.dest_id == target->stone_id)) {
			config->pending_action_queue[k].u.link.dest_id = bridge->stone_id;
			break;
		    }
		}
		bridge->node = cur->node;
		CMtrace_out(dfg->master->cm, EVdfgVerbose, "Created bridge stone %x, target node is %d, assigned to node %d\n", cur->out_links[j], target->node, cur->node);
	    }
	}
    }
}